

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall
spv::Builder::createDebugLocalVariable(Builder *this,Id type,char *name,size_t argNumber)

{
  uint value;
  Id IVar1;
  Instruction *this_00;
  size_t sVar2;
  _Elt_pointer puVar3;
  Id IVar4;
  string local_50;
  
  if (name == (char *)0x0) {
    __assert_fail("name != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x4c8,
                  "Id spv::Builder::createDebugLocalVariable(Id, const char *const, const size_t)");
  }
  if ((this->currentDebugScopeId).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->currentDebugScopeId).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur) {
    this_00 = (Instruction *)operator_new(0x60);
    IVar4 = this->uniqueId + 1;
    this->uniqueId = IVar4;
    IVar1 = makeVoidType(this);
    this_00->_vptr_Instruction = (_func_int **)&PTR__Instruction_00927e68;
    this_00->resultId = IVar4;
    this_00->typeId = IVar1;
    this_00->opCode = OpExtInst;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_finish.super__Bit_iterator_base._M_offset = 0;
    (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_offset = 0;
    (this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_end_of_storage = (_Bit_pointer)0x0;
    this_00->block = (Block *)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&this_00->operands,9);
    if ((ulong)(((long)(this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage -
                (long)(this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) < 9) {
      std::vector<bool,_std::allocator<bool>_>::_M_reallocate(&this_00->idOperand,9);
    }
    Instruction::addIdOperand(this_00,this->nonSemanticShaderDebugInfo);
    Instruction::addImmediateOperand(this_00,0x1a);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    sVar2 = strlen(name);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,name,name + sVar2);
    IVar1 = getStringId(this,&local_50);
    Instruction::addIdOperand(this_00,IVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    Instruction::addIdOperand(this_00,type);
    IVar1 = makeDebugSource(this,this->currentFileId);
    Instruction::addIdOperand(this_00,IVar1);
    value = this->currentLine;
    IVar1 = makeIntegerType(this,0x20,false);
    IVar1 = makeIntConstant(this,IVar1,value,false);
    Instruction::addIdOperand(this_00,IVar1);
    IVar1 = makeIntegerType(this,0x20,false);
    IVar1 = makeIntConstant(this,IVar1,0,false);
    Instruction::addIdOperand(this_00,IVar1);
    puVar3 = (this->currentDebugScopeId).c.
             super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (puVar3 == (this->currentDebugScopeId).c.
                  super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      puVar3 = (this->currentDebugScopeId).c.
               super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    Instruction::addIdOperand(this_00,puVar3[-1]);
    IVar1 = makeIntegerType(this,0x20,false);
    IVar1 = makeIntConstant(this,IVar1,4,false);
    Instruction::addIdOperand(this_00,IVar1);
    if (argNumber != 0) {
      IVar1 = makeIntegerType(this,0x20,false);
      IVar1 = makeIntConstant(this,IVar1,(uint)argNumber,false);
      Instruction::addIdOperand(this_00,IVar1);
    }
    local_50._M_dataplus._M_p = (pointer)this_00;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&this->constantsTypesGlobals,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_50);
    if ((Instruction *)local_50._M_dataplus._M_p != (Instruction *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
    Module::mapInstruction(&this->module,this_00);
    return this_00->resultId;
  }
  __assert_fail("!currentDebugScopeId.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0x4c9,
                "Id spv::Builder::createDebugLocalVariable(Id, const char *const, const size_t)");
}

Assistant:

Id Builder::createDebugLocalVariable(Id type, char const*const name, size_t const argNumber)
{
    assert(name != nullptr);
    assert(!currentDebugScopeId.empty());

    Instruction* inst = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    inst->reserveOperands(9);
    inst->addIdOperand(nonSemanticShaderDebugInfo);
    inst->addImmediateOperand(NonSemanticShaderDebugInfo100DebugLocalVariable);
    inst->addIdOperand(getStringId(name)); // name id
    inst->addIdOperand(type); // type id
    inst->addIdOperand(makeDebugSource(currentFileId)); // source id
    inst->addIdOperand(makeUintConstant(currentLine)); // line id
    inst->addIdOperand(makeUintConstant(0)); // TODO: column id
    inst->addIdOperand(currentDebugScopeId.top()); // scope id
    inst->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100FlagIsLocal)); // flags id
    if(argNumber != 0) {
        inst->addIdOperand(makeUintConstant(argNumber));
    }

    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(inst));
    module.mapInstruction(inst);

    return inst->getResultId();
}